

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::find(Path *this,_func_bool_Path_ptr *cb)

{
  bool bVar1;
  string *psVar2;
  Path *path_00;
  Path path;
  entry_iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  entry_iterator local_88;
  Path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  entry_iterator::entry_iterator(&local_88,this);
  while( true ) {
    entry_iterator::entry_iterator((entry_iterator *)&local_a8);
    bVar1 = entry_iterator::operator!=(&local_88,(entry_iterator *)&local_a8);
    entry_iterator::~entry_iterator((entry_iterator *)&local_a8);
    if (!bVar1) break;
    psVar2 = (string *)entry_iterator::operator->(&local_88);
    std::__cxx11::string::string((string *)&local_a8,psVar2);
    bVar1 = std::operator!=(&local_a8,".");
    if (bVar1) {
      psVar2 = (string *)entry_iterator::operator->(&local_88);
      std::__cxx11::string::string((string *)&local_50,psVar2);
      bVar1 = std::operator!=(&local_50,"..");
      std::__cxx11::string::_M_dispose();
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::_M_dispose();
    if (bVar1 != false) {
      path_00 = entry_iterator::operator*(&local_88);
      Path(&local_70,path_00);
      join((Path *)&local_a8,this,&local_70);
      std::__cxx11::string::_M_dispose();
      bVar1 = (*cb)((Path *)&local_a8);
      if (bVar1) {
        bVar1 = is_directory((Path *)&local_a8);
        if (bVar1) {
          find((Path *)&local_a8,cb);
        }
      }
      std::__cxx11::string::_M_dispose();
    }
    entry_iterator::operator++(&local_88,0);
  }
  entry_iterator::~entry_iterator(&local_88);
  return;
}

Assistant:

void Path::find(bool (*cb)(const Path& entry)) const
{
  for(entry_iterator iter=begin_entries(); iter != end_entries(); iter++) {
    // Skip . and ..
    if (iter->str() != "." && iter->str() != "..") {
      Path path = join(*iter);
      if (cb(path) && path.is_directory()) {
        path.find(cb);
      }
    }
  }
}